

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default-value.cpp
# Opt level: O3

void simple_default_values(void)

{
  char *pcVar1;
  
  pcVar1 = rtosc::get_default_value("A",&ports,(void *)0x0,(Port *)0x0,1);
  assert_str_eq(pcVar1,"64","get integer default value",0x53);
  pcVar1 = rtosc::get_default_value("B0",&ports,(void *)0x0,(Port *)0x0,1);
  assert_str_eq(pcVar1,"Off","get integer array default value with options",0x55);
  pcVar1 = rtosc::get_default_value("B1",&ports,(void *)0x0,(Port *)0x0,1);
  assert_str_eq(pcVar1,"Off","get integer array default value with options",0x57);
  pcVar1 = rtosc::get_default_value("C",&ports,(void *)0x0,(Port *)0x0,1);
  assert_str_eq(pcVar1,"false","get boolean default value",0x59);
  pcVar1 = rtosc::get_default_value("D",&ports,(void *)0x0,(Port *)0x0,1);
  assert_str_eq(pcVar1,"1.0","get float default value",0x5b);
  pcVar1 = rtosc::get_default_value("E",&ports,(void *)0x0,(Port *)0x0,1);
  assert_null(pcVar1,"get default value where there\'s none",0x5d);
  return;
}

Assistant:

void simple_default_values()
{
    assert_str_eq(get_default_value("A", ports, NULL), "64",
                  "get integer default value", __LINE__);
    assert_str_eq(get_default_value("B0", ports, NULL), "Off",
                  "get integer array default value with options", __LINE__);
    assert_str_eq(get_default_value("B1", ports, NULL), "Off",
                  "get integer array default value with options", __LINE__);
    assert_str_eq(get_default_value("C", ports, NULL), "false",
                  "get boolean default value", __LINE__);
    assert_str_eq(get_default_value("D", ports, NULL), "1.0",
                  "get float default value", __LINE__);
    assert_null(get_default_value("E", ports, NULL),
                "get default value where there's none", __LINE__);
}